

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall
amrex::BaseFab<amrex::EBCellFlag>::resize(BaseFab<amrex::EBCellFlag> *this,Box *b,int n,Arena *ar)

{
  long lVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  BaseFab<amrex::EBCellFlag> *this_00;
  Long LVar4;
  Arena *in_RCX;
  uint in_EDX;
  undefined8 *in_RSI;
  Box *in_RDI;
  BaseFab<amrex::EBCellFlag> *in_stack_ffffffffffffffa8;
  BaseFab<amrex::EBCellFlag> *in_stack_ffffffffffffffb0;
  DataAllocator local_38;
  Arena *local_30;
  char *local_10;
  char *local_8;
  
  in_RDI[1].btype.itype = in_EDX;
  *(undefined8 *)&in_RDI->btype = *in_RSI;
  *(undefined8 *)(in_RDI[1].smallend.vect + 1) = in_RSI[1];
  *(undefined8 *)in_RDI[1].bigend.vect = in_RSI[2];
  in_RDI[1].bigend.vect[2] = *(int *)(in_RSI + 3);
  local_30 = in_RCX;
  if (in_RCX == (Arena *)0x0) {
    local_30 = *(Arena **)((long)(in_RDI->smallend).vect + 8);
  }
  pAVar2 = DataAllocator::arena((DataAllocator *)in_RDI);
  DataAllocator::DataAllocator(&local_38,local_30);
  pAVar3 = DataAllocator::arena((DataAllocator *)in_RDI);
  if (pAVar2 == pAVar3) {
    if ((*(long *)((in_RDI->bigend).vect + 1) == 0) || ((in_RDI[2].smallend.vect[2] & 1) == 0)) {
      if ((*(byte *)((long)in_RDI[2].smallend.vect + 9) & 1) != 0) {
        local_8 = "BaseFab::resize: BaseFab in shared memory cannot increase size";
        Abort_host((char *)in_RDI);
      }
      (in_RDI->bigend).vect[1] = 0;
      (in_RDI->bigend).vect[2] = 0;
      define(in_stack_ffffffffffffffb0);
    }
    else {
      this_00 = (BaseFab<amrex::EBCellFlag> *)(long)(int)in_RDI[1].btype.itype;
      LVar4 = Box::numPts(in_RDI);
      lVar1 = *(long *)in_RDI[2].smallend.vect;
      if ((long)this_00 * LVar4 - lVar1 != 0 && lVar1 <= (long)this_00 * LVar4) {
        if ((*(byte *)((long)in_RDI[2].smallend.vect + 9) & 1) != 0) {
          local_10 = "BaseFab::resize: BaseFab in shared memory cannot increase size";
          Abort_host((char *)in_RDI);
        }
        clear(in_stack_ffffffffffffffa8);
        define(this_00);
      }
    }
  }
  else {
    clear(in_stack_ffffffffffffffa8);
    *(Arena **)((in_RDI->smallend).vect + 2) = local_30;
    define(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void
BaseFab<T>::resize (const Box& b, int n, Arena* ar)
{
    this->nvar   = n;
    this->domain = b;

    if (ar == nullptr) {
        ar = m_arena;
    }

    if (arena() != DataAllocator(ar).arena()) {
        clear();
        m_arena = ar;
        define();
    }
    else if (this->dptr == 0 || !this->ptr_owner)
    {
        if (this->shared_memory)
            amrex::Abort("BaseFab::resize: BaseFab in shared memory cannot increase size");

        this->dptr = nullptr;
        define();
    }
    else if (this->nvar*this->domain.numPts() > this->truesize)
    {
        if (this->shared_memory)
            amrex::Abort("BaseFab::resize: BaseFab in shared memory cannot increase size");

        clear();

        define();
    }
}